

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

char * __thiscall
testing::internal::TypedTestCasePState::VerifyRegisteredTestNames
          (TypedTestCasePState *this,char *file,int line,char *registered_tests)

{
  FILE *__stream;
  bool bVar1;
  char *pcVar2;
  size_type sVar3;
  Message *pMVar4;
  reference ppcVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int line_00;
  char *extraout_RDX;
  char *pcVar8;
  char *extraout_RDX_00;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar9;
  string local_140;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  string *errors_str;
  key_type local_f0;
  _Self local_d0;
  _Self local_c8;
  DefinedTestIter it_1;
  _Self local_b0;
  _Self local_a8;
  DefinedTestIter it;
  bool found;
  undefined1 local_88 [8];
  string name;
  char *names;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  Message errors;
  char *registered_tests_local;
  int line_local;
  char *file_local;
  TypedTestCasePState *this_local;
  
  *this = (TypedTestCasePState)0x1;
  pcVar2 = SkipSpaces(registered_tests);
  Message::Message((Message *)&tests._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&names);
  pcVar8 = extraout_RDX;
  name.field_2._8_8_ = pcVar2;
  do {
    if (name.field_2._8_8_ == 0) {
      local_c8._M_node =
           (_Base_ptr)
           std::set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_>::begin
                     ((set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_> *)
                      (this + 8));
      while( true ) {
        local_d0._M_node =
             (_Base_ptr)
             std::set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_>::end
                       ((set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_> *
                        )(this + 8));
        bVar1 = std::operator!=(&local_c8,&local_d0);
        line_00 = (int)registered_tests;
        if (!bVar1) break;
        ppcVar5 = std::_Rb_tree_const_iterator<const_char_*>::operator*(&local_c8);
        pcVar8 = *ppcVar5;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,pcVar8,(allocator<char> *)((long)&errors_str + 7));
        sVar3 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&names,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&errors_str + 7));
        if (sVar3 == 0) {
          pMVar4 = Message::operator<<((Message *)
                                       &tests._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                       (char (*) [25])"You forgot to list test ");
          ppcVar5 = std::_Rb_tree_const_iterator<const_char_*>::operator*(&local_c8);
          pMVar4 = Message::operator<<(pMVar4,ppcVar5);
          Message::operator<<(pMVar4,(char (*) [3])0x172eba);
        }
        std::_Rb_tree_const_iterator<const_char_*>::operator++(&local_c8);
      }
      Message::GetString_abi_cxx11_
                (&local_120,(Message *)&tests._M_t._M_impl.super__Rb_tree_header._M_node_count);
      local_100 = &local_120;
      bVar1 = std::operator!=(local_100,"");
      __stream = _stderr;
      if (bVar1) {
        FormatFileLocation_abi_cxx11_(&local_140,(internal *)file,(char *)(ulong)(uint)line,line_00)
        ;
        uVar6 = std::__cxx11::string::c_str();
        uVar7 = std::__cxx11::string::c_str();
        fprintf(__stream,"%s %s",uVar6,uVar7);
        std::__cxx11::string::~string((string *)&local_140);
        fflush(_stderr);
        posix::Abort();
      }
      std::__cxx11::string::~string((string *)&local_120);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&names);
      Message::~Message((Message *)&tests._M_t._M_impl.super__Rb_tree_header._M_node_count);
      return pcVar2;
    }
    GetPrefixUntilComma_abi_cxx11_((string *)local_88,(internal *)name.field_2._8_8_,pcVar8);
    sVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&names,(key_type *)local_88);
    if (sVar3 == 0) {
      it._M_node._7_1_ = 0;
      local_a8._M_node =
           (_Base_ptr)
           std::set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_>::begin
                     ((set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_> *)
                      (this + 8));
      while( true ) {
        local_b0._M_node =
             (_Base_ptr)
             std::set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_>::end
                       ((set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_> *
                        )(this + 8));
        bVar1 = std::operator!=(&local_a8,&local_b0);
        if (!bVar1) break;
        ppcVar5 = std::_Rb_tree_const_iterator<const_char_*>::operator*(&local_a8);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_88,*ppcVar5);
        if (bVar1) {
          it._M_node._7_1_ = 1;
          break;
        }
        std::_Rb_tree_const_iterator<const_char_*>::operator++(&local_a8);
      }
      if ((it._M_node._7_1_ & 1) == 0) {
        pMVar4 = Message::operator<<((Message *)
                                     &tests._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                     (char (*) [15])"No test named ");
        pMVar4 = Message::operator<<(pMVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_88);
        Message::operator<<(pMVar4,(char (*) [34])" can be found in this test case.\n");
      }
      else {
        pVar9 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&names,(value_type *)local_88);
        registered_tests = (char *)pVar9.first._M_node;
        it_1._M_node = (_Base_ptr)registered_tests;
      }
    }
    else {
      pMVar4 = Message::operator<<((Message *)
                                   &tests._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                   (char (*) [6])"Test ");
      pMVar4 = Message::operator<<(pMVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_88);
      Message::operator<<(pMVar4,(char (*) [28])" is listed more than once.\n");
    }
    std::__cxx11::string::~string((string *)local_88);
    name.field_2._8_8_ = (size_type)SkipComma(name.field_2._8_8_);
    pcVar8 = extraout_RDX_00;
  } while( true );
}

Assistant:

const char* TypedTestCasePState::VerifyRegisteredTestNames(
    const char* file, int line, const char* registered_tests) {
  typedef ::std::set<const char*>::const_iterator DefinedTestIter;
  registered_ = true;

  // Skip initial whitespace in registered_tests since some
  // preprocessors prefix stringizied literals with whitespace.
  registered_tests = SkipSpaces(registered_tests);

  Message errors;
  ::std::set<std::string> tests;
  for (const char* names = registered_tests; names != NULL;
       names = SkipComma(names)) {
    const std::string name = GetPrefixUntilComma(names);
    if (tests.count(name) != 0) {
      errors << "Test " << name << " is listed more than once.\n";
      continue;
    }

    bool found = false;
    for (DefinedTestIter it = defined_test_names_.begin();
         it != defined_test_names_.end();
         ++it) {
      if (name == *it) {
        found = true;
        break;
      }
    }

    if (found) {
      tests.insert(name);
    } else {
      errors << "No test named " << name
             << " can be found in this test case.\n";
    }
  }

  for (DefinedTestIter it = defined_test_names_.begin();
       it != defined_test_names_.end();
       ++it) {
    if (tests.count(*it) == 0) {
      errors << "You forgot to list test " << *it << ".\n";
    }
  }

  const std::string& errors_str = errors.GetString();
  if (errors_str != "") {
    fprintf(stderr, "%s %s", FormatFileLocation(file, line).c_str(),
            errors_str.c_str());
    fflush(stderr);
    posix::Abort();
  }

  return registered_tests;
}